

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

Matrix4x4 * __thiscall
CMU462::DynamicScene::Joint::getBindTransformation(Matrix4x4 *__return_storage_ptr__,Joint *this)

{
  Vector3D local_250;
  Matrix4x4 local_238;
  Matrix4x4 local_1b8;
  Vector3D local_138;
  Matrix4x4 local_120;
  Matrix4x4 local_a0;
  Joint *local_20;
  Joint *j;
  Joint *this_local;
  Matrix4x4 *T;
  
  j = this;
  this_local = (Joint *)__return_storage_ptr__;
  Matrix4x4::identity();
  for (local_20 = this->parent; local_20 != (Joint *)0x0; local_20 = local_20->parent) {
    Vector3D::Vector3D(&local_138,&local_20->axis);
    Matrix4x4::translation(&local_120,&local_138);
    Matrix4x4::operator*(&local_a0,&local_120,__return_storage_ptr__);
    memcpy(__return_storage_ptr__,&local_a0,0x80);
  }
  Vector3D::Vector3D(&local_250,&(this->skeleton->root->super_SceneObject).position);
  Matrix4x4::translation(&local_238,&local_250);
  Matrix4x4::operator*(&local_1b8,&local_238,__return_storage_ptr__);
  memcpy(__return_storage_ptr__,&local_1b8,0x80);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Joint::getBindTransformation()
   {
     Matrix4x4 T = Matrix4x4::identity();
     for (Joint* j = parent; j != nullptr; j = j->parent)
     {
       T = Matrix4x4::translation(j->axis) * T;
     }

     // Allow skeleton translation by taking root's position into account
     T = Matrix4x4::translation(skeleton->root->position) * T;

     return T;
   }